

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

s32 __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
          (array<irr::CIrrDeviceSDL::SKeyMap> *this,SKeyMap *element,s32 left,s32 right)

{
  bool bVar1;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  __last;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  __val;
  reference pSVar2;
  difference_type dVar3;
  int in_ECX;
  int in_EDX;
  SKeyMap *in_RSI;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  it;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  rpos;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  lpos;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  in_stack_ffffffffffffffb8;
  
  if (in_EDX <= in_ECX) {
    ::std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>::begin
              ((vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_> *)
               in_stack_ffffffffffffff88._M_current);
    __last = ::std::
             next<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_const*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>>
                       (in_stack_ffffffffffffff88,0x3942c5);
    ::std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>::begin
              ((vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_> *)
               in_stack_ffffffffffffff88._M_current);
    __val = ::std::
            next<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_const*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>>
                      (in_stack_ffffffffffffff88,0x3942e8);
    ::std::
    lower_bound<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_const*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>,irr::CIrrDeviceSDL::SKeyMap>
              (in_stack_ffffffffffffffb8,__last,__val._M_current);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
             ::operator*((__normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                          *)&stack0xffffffffffffffb8);
    bVar1 = CIrrDeviceSDL::SKeyMap::operator<(pSVar2,in_RSI);
    if (!bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
               ::operator*((__normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                            *)&stack0xffffffffffffffb8);
      bVar1 = CIrrDeviceSDL::SKeyMap::operator<(in_RSI,pSVar2);
      if (!bVar1) {
        ::std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>::
        begin((vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_> *)
              in_stack_ffffffffffffff88._M_current);
        dVar3 = __gnu_cxx::operator-
                          ((__normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                            *)in_RSI,
                           (__normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
                            *)in_stack_ffffffffffffff88._M_current);
        return (s32)dVar3;
      }
    }
  }
  return -1;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}